

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deorbitalized.hpp
# Opt level: O1

void ExchCXX::
     kernel_traits<ExchCXX::Deorbitalized<ExchCXX::BuiltinR2SCAN_X,_ExchCXX::BuiltinPC07OPT_K>_>::
     eval_exc_vxc_polar(double rho_a,double rho_b,double sigma_aa,double sigma_ab,double sigma_bb,
                       double lapl_a,double lapl_b,double tau_a,double tau_b,double *eps,
                       double *vrho_a,double *vrho_b,double *vsigma_aa,double *vsigma_ab,
                       double *vsigma_bb,double *vlapl_a,double *vlapl_b,double *vtau_a,
                       double *vtau_b)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  double dVar7;
  double dVar8;
  double dVar9;
  undefined1 auVar10 [16];
  double local_e0;
  double TAU_B;
  double local_d0;
  double local_c8;
  double local_c0;
  double vlapl_b_k;
  double vlapl_a_k;
  double vsigma_bb_k;
  double vsigma_aa_k;
  double vrho_b_k;
  double vrho_a_k;
  double local_88;
  double local_78;
  double local_68;
  double local_58;
  double local_48;
  
  local_d0 = 0.0;
  vrho_a_k = 0.0;
  local_e0 = 0.0;
  vsigma_aa_k = 0.0;
  vlapl_a_k = 0.0;
  local_c8 = lapl_a;
  local_c0 = lapl_b;
  local_88 = rho_b;
  local_78 = rho_a;
  local_68 = sigma_bb;
  local_58 = sigma_aa;
  local_48 = sigma_ab;
  if (1e-15 < rho_a) {
    dVar3 = 1.0000000000000052e-40;
    if (1.0000000000000052e-40 <= sigma_aa) {
      dVar3 = sigma_aa;
    }
    dVar7 = (dVar3 + 1.0000000000000052e-40) * 0.5;
    dVar8 = 1e-15;
    if (1e-15 <= rho_a) {
      dVar8 = rho_a;
    }
    dVar9 = (double)(~-(ulong)(-dVar7 <= dVar7) & (ulong)-dVar7);
    uVar1 = -(ulong)(dVar9 <= dVar7);
    kernel_traits<ExchCXX::BuiltinPC07OPT_K>::eval_exc_vxc_polar_impl
              (dVar8,1e-15,dVar3,(double)(~uVar1 & (ulong)dVar7 | uVar1 & (ulong)dVar9),
               1.0000000000000052e-40,lapl_a,0.0,0.0,0.0,&local_d0,&vrho_a_k,&local_e0,&vsigma_aa_k,
               &local_e0,&local_e0,&vlapl_a_k,&local_e0,&local_e0,&local_e0);
  }
  TAU_B = 0.0;
  vrho_b_k = 0.0;
  local_e0 = 0.0;
  vsigma_bb_k = 0.0;
  vlapl_b_k = 0.0;
  if (1e-15 < local_88) {
    dVar3 = 1.0000000000000052e-40;
    if (1.0000000000000052e-40 <= local_68) {
      dVar3 = local_68;
    }
    dVar7 = (dVar3 + 1.0000000000000052e-40) * 0.5;
    dVar8 = 1e-15;
    if (1e-15 <= local_88) {
      dVar8 = local_88;
    }
    dVar9 = (double)(~-(ulong)(-dVar7 <= dVar7) & (ulong)-dVar7);
    uVar1 = -(ulong)(dVar9 <= dVar7);
    kernel_traits<ExchCXX::BuiltinPC07OPT_K>::eval_exc_vxc_polar_impl
              (dVar8,1e-15,dVar3,(double)(~uVar1 & (ulong)dVar7 | uVar1 & (ulong)dVar9),
               1.0000000000000052e-40,local_c0,0.0,0.0,0.0,&TAU_B,&vrho_b_k,&local_e0,&vsigma_bb_k,
               &local_e0,&local_e0,&vlapl_b_k,&local_e0,&local_e0,&local_e0);
  }
  auVar2._8_8_ = local_88;
  auVar2._0_8_ = local_78;
  local_d0 = local_d0 * local_78;
  TAU_B = TAU_B * local_88;
  *eps = 0.0;
  *vrho_a = 0.0;
  *vrho_b = 0.0;
  *vsigma_aa = 0.0;
  *vsigma_ab = 0.0;
  *vsigma_bb = 0.0;
  *vlapl_a = 0.0;
  *vlapl_b = 0.0;
  *vtau_a = 0.0;
  *vtau_b = 0.0;
  if (1e-11 < local_78 + local_88) {
    auVar6._8_8_ = local_68;
    auVar6._0_8_ = local_58;
    auVar6 = maxpd(_DAT_01041230,auVar6);
    auVar2 = maxpd(_DAT_01041220,auVar2);
    auVar5._8_8_ = TAU_B;
    auVar5._0_8_ = local_d0;
    auVar10 = maxpd(_DAT_01041200,auVar5);
    auVar4._0_8_ = auVar2._0_8_ * 8.0 * auVar10._0_8_;
    auVar4._8_8_ = auVar2._8_8_ * 8.0 * auVar10._8_8_;
    auVar5 = minpd(auVar4,auVar6);
    dVar3 = (auVar5._8_8_ + auVar5._0_8_) * 0.5;
    uVar1 = -(ulong)(-dVar3 <= local_48);
    dVar8 = (double)(uVar1 & (ulong)local_48 | ~uVar1 & (ulong)-dVar3);
    uVar1 = -(ulong)(dVar8 <= dVar3);
    kernel_traits<ExchCXX::BuiltinR2SCAN_X>::eval_exc_vxc_polar_impl
              (auVar2._0_8_,auVar2._8_8_,auVar5._0_8_,
               (double)(~uVar1 & (ulong)dVar3 | uVar1 & (ulong)dVar8),auVar5._8_8_,local_c8,local_c0
               ,auVar10._0_8_,auVar10._8_8_,eps,vrho_a,vrho_b,vsigma_aa,vsigma_ab,vsigma_bb,vlapl_a,
               vlapl_b,vtau_a,vtau_b);
  }
  *vrho_a = *vtau_a * vrho_a_k + *vrho_a;
  *vrho_b = *vtau_b * vrho_b_k + *vrho_b;
  *vsigma_aa = *vtau_a * vsigma_aa_k + *vsigma_aa;
  *vsigma_bb = *vtau_b * vsigma_bb_k + *vsigma_bb;
  *vlapl_a = *vtau_a * vlapl_a_k;
  *vlapl_b = *vtau_b * vlapl_b_k;
  *vtau_a = 0.0;
  *vtau_b = 0.0;
  return;
}

Assistant:

BUILTIN_KERNEL_EVAL_RETURN
    eval_exc_vxc_polar( double rho_a, double rho_b, double sigma_aa, double sigma_ab, double sigma_bb, double lapl_a, double lapl_b, double tau_a, double tau_b, double& eps, double& vrho_a, double& vrho_b, double& vsigma_aa, double& vsigma_ab, double& vsigma_bb, double& vlapl_a, double& vlapl_b, double& vtau_a, double& vtau_b ) {

    double TAU_A, TAU_B, vrho_a_k, vrho_b_k, vsigma_aa_k, vsigma_bb_k, vlapl_a_k, vlapl_b_k, vtau_k, dummy;
    ke_traits::eval_exc_vxc_polar(rho_a, 0.0, sigma_aa, 0.0, 0.0, lapl_a, 0.0, 0.0, 0.0, TAU_A, vrho_a_k, dummy, vsigma_aa_k, dummy, dummy, vlapl_a_k, dummy, dummy, dummy);
    ke_traits::eval_exc_vxc_polar(rho_b, 0.0, sigma_bb, 0.0, 0.0, lapl_b, 0.0, 0.0, 0.0, TAU_B, vrho_b_k, dummy, vsigma_bb_k, dummy, dummy, vlapl_b_k, dummy, dummy, dummy);

    TAU_A *= rho_a;
    TAU_B *= rho_b;

    xc_traits::eval_exc_vxc_polar(rho_a, rho_b, sigma_aa, sigma_ab, sigma_bb, lapl_a, lapl_b, TAU_A, TAU_B, eps, vrho_a, vrho_b, vsigma_aa, vsigma_ab, vsigma_bb, vlapl_a, vlapl_b, vtau_a, vtau_b);

    vrho_a    += vtau_a * vrho_a_k;
    vrho_b    += vtau_b * vrho_b_k;
    vsigma_aa += vtau_a * vsigma_aa_k;
    //vsigma_ab += .....;
    vsigma_bb += vtau_b * vsigma_bb_k;
    vlapl_a    = vtau_a * vlapl_a_k;
    vlapl_b    = vtau_b * vlapl_b_k;
    vtau_a     = 0.0;
    vtau_b     = 0.0;
  }